

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AtanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_atanh(NeuralNetworkLayer *this)

{
  AtanhLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x30c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x30c;
    this_00 = (AtanhLayerParams *)operator_new(0x18);
    AtanhLayerParams::AtanhLayerParams(this_00);
    (this->layer_).atanh_ = this_00;
  }
  return (AtanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanhLayerParams* NeuralNetworkLayer::mutable_atanh() {
  if (!has_atanh()) {
    clear_layer();
    set_has_atanh();
    layer_.atanh_ = new ::CoreML::Specification::AtanhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.atanh)
  return layer_.atanh_;
}